

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

StringMapEntry<llbuild::ninja::Pool_*> *
llvm::StringMapEntry<llbuild::ninja::Pool_*>::Create<llvm::MallocAllocator>
          (StringRef Key,MallocAllocator *Allocator)

{
  StringMapEntry<llbuild::ninja::Pool_*> *pSVar1;
  size_t __n;
  
  __n = Key.Length;
  pSVar1 = (StringMapEntry<llbuild::ninja::Pool_*> *)safe_malloc(__n + 0x11);
  (pSVar1->super_StringMapEntryBase).StrLen = __n;
  pSVar1->second = (Pool *)0x0;
  if (__n != 0) {
    memcpy(pSVar1 + 1,Key.Data,__n);
  }
  *(undefined1 *)((long)&pSVar1[1].super_StringMapEntryBase.StrLen + __n) = 0;
  return pSVar1;
}

Assistant:

static StringMapEntry *Create(StringRef Key, AllocatorTy &Allocator,
                                InitTy &&... InitVals) {
    size_t KeyLength = Key.size();

    // Allocate a new item with space for the string at the end and a null
    // terminator.
    size_t AllocSize = sizeof(StringMapEntry) + KeyLength + 1;
    size_t Alignment = alignof(StringMapEntry);

    StringMapEntry *NewItem =
      static_cast<StringMapEntry*>(Allocator.Allocate(AllocSize,Alignment));
    assert(NewItem && "Unhandled out-of-memory");

    // Construct the value.
    new (NewItem) StringMapEntry(KeyLength, std::forward<InitTy>(InitVals)...);

    // Copy the string information.
    char *StrBuffer = const_cast<char*>(NewItem->getKeyData());
    if (KeyLength > 0)
      memcpy(StrBuffer, Key.data(), KeyLength);
    StrBuffer[KeyLength] = 0;  // Null terminate for convenience of clients.
    return NewItem;
  }